

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barcode.h
# Opt level: O1

void __thiscall
barcode_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t>::
computing_barcodes_in_dimension
          (barcode_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t> *this,
          unsigned_short dimension)

{
  ofstream *poVar1;
  ostream *poVar2;
  
  if ((this->min_dimension <= dimension) && (dimension <= this->max_dimension)) {
    poVar1 = &(this->
              super_file_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t>)
              .outstream;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"# persistence intervals in dimension ",0x25);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  this->current_dimension = dimension;
  return;
}

Assistant:

void computing_barcodes_in_dimension(unsigned short dimension) {
		if (dimension >= min_dimension && dimension <= max_dimension)
			file_output_t<Complex>::outstream << "# persistence intervals in dimension " << dimension << std::endl;
		current_dimension = dimension;
	}